

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asListAnySize(ListBuilder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  uint uVar4;
  StructDataBitCount SVar5;
  CapTableBuilder *pCVar6;
  ElementSize EVar7;
  SegmentBuilder *this_00;
  ulong uVar8;
  OrphanBuilder *pOVar9;
  word *pwVar10;
  Fault f;
  Fault local_38;
  
  uVar4 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar4 != 0) {
    this_00 = this->segment;
    pCVar6 = this->capTable;
    if ((uVar4 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar4 = (uint)(this->tag).content;
      pwVar10 = (this_00->super_SegmentReader).ptr.ptr;
      uVar8 = (ulong)(uVar4 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar10->content + uVar8);
      pOVar9 = (OrphanBuilder *)((long)&pwVar10[1].content + uVar8);
      if ((uVar4 & 4) == 0) {
        pwVar10 = &pOVar9->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar9 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar10 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                          (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar10 = this->location;
      pOVar9 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((pOVar9->tag).content & 3) == 1) {
      uVar4 = *(uint *)((long)&(pOVar9->tag).content + 4);
      EVar7 = (ElementSize)uVar4 & INLINE_COMPOSITE;
      if (EVar7 == INLINE_COMPOSITE) {
        uVar4 = (uint)pwVar10->content;
        if ((uVar4 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x575,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&local_38);
        }
        uVar2 = *(ushort *)((long)&pwVar10->content + 4);
        uVar3 = *(ushort *)((long)&pwVar10->content + 6);
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar6;
        __return_storage_ptr__->ptr = (byte *)(pwVar10 + 1);
        __return_storage_ptr__->elementCount = uVar4 >> 2 & 0x1fffffff;
        __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->structPointerCount = uVar3;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      }
      else {
        SVar5 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar7 * 4);
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar6;
        __return_storage_ptr__->ptr = (byte *)pwVar10;
        __return_storage_ptr__->elementCount = uVar4 >> 3;
        __return_storage_ptr__->step = (uint)(EVar7 == POINTER) * 0x40 + SVar5;
        __return_storage_ptr__->structDataSize = SVar5;
        __return_storage_ptr__->structPointerCount = (ushort)(EVar7 == POINTER);
        __return_storage_ptr__->elementSize = EVar7;
      }
      goto LAB_00198e1f;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[75]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x56b,FAILED,"ref->kind() == WirePointer::LIST",
               "\"Called getWritableListPointerAnySize() but existing pointer is not a list.\"",
               (char (*) [75])
               "Called getWritableListPointerAnySize() but existing pointer is not a list.");
    kj::_::Debug::Fault::~Fault(&local_38);
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  pwVar10 = (word *)0x0;
LAB_00198e1f:
  this->location = pwVar10;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asListAnySize() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointerAnySize(
      tagAsPtr(), location, segment, capTable, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}